

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::SimpleFieldComparator::CompareWithDifferencer
          (SimpleFieldComparator *this,MessageDifferencer *differencer,Message *message1,
          Message *message2,FieldContext *field_context)

{
  char *pcVar1;
  bool bVar2;
  LogMessage *pLVar3;
  string_view v;
  string_view v_00;
  Metadata MVar4;
  Metadata MVar5;
  LogMessage local_40;
  
  MVar4 = Message::GetMetadata(message1);
  MVar5 = Message::GetMetadata(message2);
  if (MVar4.descriptor == MVar5.descriptor) {
    bVar2 = MessageDifferencer::Compare
                      (differencer,message1,message2,0,field_context->parent_fields_);
    return bVar2;
  }
  absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator.cc"
             ,0x90);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_40,(char (*) [48])"Comparison between two messages with different ");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar3,(char (*) [14])"descriptors. ");
  pcVar1 = ((MVar4.descriptor)->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,(char (*) [5])" vs ");
  pcVar1 = ((MVar5.descriptor)->all_names_).payload_;
  v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v_00._M_str = pcVar1 + ~v_00._M_len;
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v_00);
  absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_40);
  return false;
}

Assistant:

bool SimpleFieldComparator::CompareWithDifferencer(
    MessageDifferencer* differencer, const Message& message1,
    const Message& message2, const util::FieldContext* field_context) {
  const Descriptor* descriptor1 = message1.GetDescriptor();
  const Descriptor* descriptor2 = message2.GetDescriptor();
  if (descriptor1 != descriptor2) {
    ABSL_DLOG(FATAL) << "Comparison between two messages with different "
                     << "descriptors. " << descriptor1->full_name() << " vs "
                     << descriptor2->full_name();
    return false;
  }
  return differencer->Compare(message1, message2, false,
                              field_context->parent_fields());
}